

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_commit(fdb_file_handle *fhandle,fdb_commit_opt_t opt)

{
  long in_RDI;
  bool in_stack_000000b6;
  fdb_commit_opt_t in_stack_000000b7;
  fdb_kvs_handle *in_stack_000000b8;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    local_4 = _fdb_commit(in_stack_000000b8,in_stack_000000b7,in_stack_000000b6);
  }
  return local_4;
}

Assistant:

fdb_status _fdb_commit(fdb_kvs_handle *handle,
                       fdb_commit_opt_t opt,
                       bool sync)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    uint64_t cur_bmp_revnum;
    fdb_txn *txn = handle->fhandle->root->txn;
    fdb_txn *earliest_txn;
    file_status_t fstatus;
    fdb_status fs = FDB_RESULT_SUCCESS;
    bool wal_flushed = false;
    bid_t dirty_idtree_root = BLK_NOT_FOUND;
    bid_t dirty_seqtree_root = BLK_NOT_FOUND;
    union wal_flush_items flush_items;
    fdb_status wr = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (handle->kvs) {
        if (handle->kvs->type == KVS_SUB) {
            // deny commit on sub handle
            return FDB_RESULT_INVALID_HANDLE;
        }
    }
    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: Commit is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

fdb_commit_start:
    fdb_check_file_reopen(handle, NULL);
    filemgr_mutex_lock(handle->file);
    fdb_sync_db_header(handle);

    if (filemgr_is_rollback_on(handle->file)) {
        filemgr_mutex_unlock(handle->file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_ROLLBACK;
    }

    fstatus = filemgr_get_file_status(handle->file);
    if (fstatus == FILE_REMOVED_PENDING) {
        // we must not commit this file
        // file status was changed by other thread .. start over
        filemgr_mutex_unlock(handle->file);
        goto fdb_commit_start;
    }

    fs = btreeblk_end(handle->bhandle);
    if (fs != FDB_RESULT_SUCCESS) {
        filemgr_mutex_unlock(handle->file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return fs;
    }

    // commit wal
    if (txn) {
        // transactional updates
        wr = wal_commit(txn, handle->file, _fdb_append_commit_mark,
                        &handle->log_callback);
        if (wr != FDB_RESULT_SUCCESS) {
            filemgr_mutex_unlock(handle->file);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return wr;
        }
        if (wal_get_dirty_status(handle->file)== FDB_WAL_CLEAN) {
            wal_set_dirty_status(handle->file, FDB_WAL_DIRTY);
        }
    } else {
        // non-transactional updates
        wal_commit(&handle->file->global_txn, handle->file, NULL,
                   &handle->log_callback);
    }

    if (wal_get_num_flushable(handle->file) > _fdb_get_wal_threshold(handle) ||
        wal_get_dirty_status(handle->file) == FDB_WAL_PENDING ||
        opt & FDB_COMMIT_MANUAL_WAL_FLUSH) {
        // wal flush when
        // 1. wal size exceeds threshold
        // 2. wal is already flushed before commit
        //    (in this case, flush the rest of entries)
        // 3. user forces to manually flush wal

        if (handle->config.bottom_up_index_build) {
            _fdb_bottom_up_index_build(handle);

        } else {
            struct filemgr_dirty_update_node *prev_node = NULL, *new_node = NULL;

            _fdb_dirty_update_ready(handle, &prev_node, &new_node,
                                    &dirty_idtree_root, &dirty_seqtree_root, false);

            wr = wal_flush(handle->file, (void *)handle,
                           _fdb_wal_flush_func, _fdb_wal_get_old_offset,
                           _fdb_wal_flush_seq_purge, _fdb_wal_flush_kvs_delta_stats,
                           &flush_items);


            if (wr != FDB_RESULT_SUCCESS) {
                btreeblk_clear_dirty_update(handle->bhandle);
                filemgr_dirty_update_close_node(handle->file, prev_node);
                filemgr_dirty_update_remove_node(handle->file, new_node);
                filemgr_mutex_unlock(handle->file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }
            wal_set_dirty_status(handle->file, FDB_WAL_CLEAN);
            wal_flushed = true;

            _fdb_dirty_update_finalize(handle, prev_node, new_node,
                                       &dirty_idtree_root, &dirty_seqtree_root, true);
        }
    }

    // Note: Appending KVS header must be done after flushing WAL
    //       because KVS stats info is updated during WAL flushing.
    if (handle->kvs) {
        // multi KV instance mode .. append up-to-date KV header
        handle->kv_info_offset = fdb_kvs_header_append(handle);
    }

    filemgr_header_revnum_t next_revnum;
    next_revnum = filemgr_get_header_revnum(handle->file)+1;

    if (handle->rollback_revnum) {
        // if this commit is called by rollback API,
        // remove all stale-tree entries related to the rollback
        fdb_rollback_stale_blocks(handle, next_revnum);
        handle->rollback_revnum = 0;
    }

    if (wal_flushed) {
        fdb_gather_stale_blocks(handle,
                                next_revnum,
                                atomic_get_uint64_t(&handle->last_hdr_bid),
                                handle->kv_info_offset,
                                filemgr_get_seqnum(handle->file),
                                NULL, false);
    }

    // Note: Getting header BID must be done after
    //       all other data are written into the file!!
    //       Or, header BID inconsistency will occur (it will
    //       point to wrong block).
    bid_t last_hdr_bid = filemgr_alloc(handle->file, &handle->log_callback);
    atomic_store_uint64_t(&handle->last_hdr_bid, last_hdr_bid);
    cur_bmp_revnum = sb_get_bmp_revnum(handle->file);

    if (wal_get_dirty_status(handle->file) == FDB_WAL_CLEAN) {
        earliest_txn = wal_earliest_txn(handle->file,
                                        (txn)?(txn):(&handle->file->global_txn));
        if (earliest_txn) {
            filemgr_header_revnum_t last_revnum;
            last_revnum = _fdb_get_header_revnum(handle, handle->last_wal_flush_hdr_bid);
            // there exists other transaction that is not committed yet
            if (last_revnum < earliest_txn->prev_revnum) {
                handle->last_wal_flush_hdr_bid = earliest_txn->prev_hdr_bid;
            }
        } else {
            // there is no other transaction .. now WAL is empty
            handle->last_wal_flush_hdr_bid = last_hdr_bid;
        }
    }

    // file header should be set after stale-block tree is updated.
    handle->cur_header_revnum = fdb_set_file_header(handle, true);

    if (txn == NULL) {
        // update global_txn's previous header BID
        handle->file->global_txn.prev_hdr_bid = handle->last_hdr_bid;
        // reset TID (this is thread-safe as filemgr_mutex is grabbed)
        handle->file->global_txn.prev_revnum = handle->cur_header_revnum;
    }

    if (handle->file->sb) {
        // sync superblock
        sb_update_header(handle);
        if (sb_check_sync_period(handle) && wal_flushed) {
            sb_decision_t decision;
            bool block_reclaimed = false;

            decision = sb_check_block_reusing(handle);
            if (decision == SBD_RECLAIM) {
                // gather reusable blocks
                btreeblk_discard_blocks(handle->bhandle);
                block_reclaimed = sb_reclaim_reusable_blocks(handle);
                if (block_reclaimed) {
                    sb_bmp_append_doc(handle);
                }
            } else if (decision == SBD_RESERVE) {
                // reserve reusable blocks
                btreeblk_discard_blocks(handle->bhandle);
                block_reclaimed = sb_reserve_next_reusable_blocks(handle);
                if (block_reclaimed) {
                    sb_rsv_append_doc(handle);
                }
            } else if (decision == SBD_SWITCH) {
                // switch reserved reusable blocks
                btreeblk_discard_blocks(handle->bhandle);
                sb_switch_reserved_blocks(handle->file);
            }
            // header should be updated one more time
            // since block reclaiming or stale block gathering changes root nodes
            // of each tree. but at this time we don't increase header revision number.
            handle->cur_header_revnum = fdb_set_file_header(handle, false);
            sb_update_header(handle);
            sb_sync_circular(handle);
            // reset allocation counter for next reclaim check
            sb_reset_num_alloc(handle);
        } else {
            // update superblock for every commit
            sb_sync_circular(handle);
        }
    }

    // file commit
    fs = filemgr_commit_bid(handle->file, handle->last_hdr_bid,
                            cur_bmp_revnum, sync, &handle->log_callback);
    if (wal_flushed) {
        wal_release_flushed_items(handle->file, &flush_items);
    }
    handle->cur_header_revnum = fdb_set_file_header(handle, true);

    btreeblk_reset_subblock_info(handle->bhandle);

    handle->dirty_updates = 0;
    filemgr_mutex_unlock(handle->file);

    LATENCY_STAT_END(handle->file, FDB_LATENCY_COMMITS);
    atomic_incr_uint64_t(&handle->op_stats->num_commits, std::memory_order_relaxed);
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return fs;
}